

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O2

void test_ADynArray_construct_destruct_noMemoryAvailable_fn(int _i)

{
  int line;
  void *pvVar1;
  char *pcVar2;
  char *expr;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
  private_ACUtilsTest_ADynArray_freeCount = 0;
  private_ACUtilsTest_ADynArray_reallocFail = 1;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  pvVar1 = private_ACUtils_ADynArray_constructWithAllocator
                     (1,private_ACUtilsTest_ADynArray_realloc,private_ACUtilsTest_ADynArray_free);
  if (pvVar1 == (void *)0x0) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x5c);
    if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x5d);
      if (private_ACUtilsTest_ADynArray_freeCount == 0) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x5e);
        private_ACUtilsTest_ADynArray_reallocFailCounter = 1;
        pvVar1 = private_ACUtils_ADynArray_constructWithAllocator
                           (1,private_ACUtilsTest_ADynArray_realloc,
                            private_ACUtilsTest_ADynArray_free);
        if (pvVar1 == (void *)0x0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x62);
          if (private_ACUtilsTest_ADynArray_reallocCount == 1) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,99);
            if (private_ACUtilsTest_ADynArray_freeCount == 1) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,100);
              return;
            }
            pcVar5 = "1";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar3 = "private_ACUtilsTest_ADynArray_freeCount == 1";
            pcVar4 = "private_ACUtilsTest_ADynArray_freeCount";
            line = 100;
            pvVar1 = (void *)private_ACUtilsTest_ADynArray_freeCount;
          }
          else {
            pcVar5 = "1";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar3 = "private_ACUtilsTest_ADynArray_reallocCount == 1";
            pcVar4 = "private_ACUtilsTest_ADynArray_reallocCount";
            line = 99;
            pvVar1 = (void *)private_ACUtilsTest_ADynArray_reallocCount;
          }
        }
        else {
          pcVar5 = (char *)0x0;
          expr = "Assertion \'_ck_x == NULL\' failed";
          pcVar2 = "Assertion \'%s\' failed: %s == %#x";
          pcVar3 = "(void*) array == NULL";
          pcVar4 = "(void*) array";
          line = 0x62;
        }
      }
      else {
        pcVar5 = "0";
        expr = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar3 = "private_ACUtilsTest_ADynArray_freeCount == 0";
        pcVar4 = "private_ACUtilsTest_ADynArray_freeCount";
        line = 0x5e;
        pvVar1 = (void *)private_ACUtilsTest_ADynArray_freeCount;
      }
    }
    else {
      pcVar5 = "0";
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar3 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
      pcVar4 = "private_ACUtilsTest_ADynArray_reallocCount";
      line = 0x5d;
      pvVar1 = (void *)private_ACUtilsTest_ADynArray_reallocCount;
    }
  }
  else {
    pcVar5 = (char *)0x0;
    expr = "Assertion \'_ck_x == NULL\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %#x";
    pcVar3 = "(void*) array == NULL";
    pcVar4 = "(void*) array";
    line = 0x5c;
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,line,expr,pcVar2,pcVar3,pcVar4,pvVar1,pcVar5);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_construct_destruct_noMemoryAvailable)
{
    struct private_ACUtilsTest_ADynArray_CharArray *array;
    private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
    private_ACUtilsTest_ADynArray_reallocFail = true;
    private_ACUtilsTest_ADynArray_reallocCount = private_ACUtilsTest_ADynArray_freeCount = 0;
    array = ADynArray_constructWithAllocator(struct private_ACUtilsTest_ADynArray_CharArray,
            private_ACUtilsTest_ADynArray_realloc, private_ACUtilsTest_ADynArray_free);
    ACUTILSTEST_ASSERT_PTR_NULL(array);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_freeCount, 0);
    private_ACUtilsTest_ADynArray_reallocFailCounter = 1;
    array = ADynArray_constructWithAllocator(struct private_ACUtilsTest_ADynArray_CharArray,
            private_ACUtilsTest_ADynArray_realloc, private_ACUtilsTest_ADynArray_free);
    ACUTILSTEST_ASSERT_PTR_NULL(array);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 1);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_freeCount, 1);
}